

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_matrix.cpp
# Opt level: O2

Reals __thiscall Omega_h::matrices_times_vectors_dim<3>(Omega_h *this,Reals *ms,Reals *vs)

{
  Alloc *pAVar1;
  int n;
  ulong uVar2;
  void *extraout_RDX;
  size_t sVar3;
  Reals RVar4;
  allocator local_79;
  Write<double> out;
  Write<signed_char> local_68;
  type f;
  
  pAVar1 = (vs->write_).shared_alloc_.alloc;
  if (((ulong)pAVar1 & 1) == 0) {
    sVar3 = pAVar1->size;
  }
  else {
    sVar3 = (ulong)pAVar1 >> 3;
  }
  n = divide_no_remainder<int>((int)(sVar3 >> 3),3);
  pAVar1 = (ms->write_).shared_alloc_.alloc;
  if (((ulong)pAVar1 & 1) == 0) {
    uVar2 = pAVar1->size;
  }
  else {
    uVar2 = (ulong)pAVar1 >> 3;
  }
  if (n * 9 == (int)(uVar2 >> 3)) {
    std::__cxx11::string::string((string *)&f,"",&local_79);
    Write<double>::Write(&out,n * 3,(string *)&f);
    std::__cxx11::string::~string((string *)&f);
    Write<double>::Write(&f.out,&out);
    Write<double>::Write(&f.ms.write_,&ms->write_);
    Write<double>::Write(&f.vs.write_,&vs->write_);
    parallel_for<Omega_h::matrices_times_vectors_dim<3>(Omega_h::Read<double>,Omega_h::Read<double>)::_lambda(int)_1_>
              (n,&f,"matrices_times_vectors");
    Write<double>::Write(&local_68,(Write<signed_char> *)&out);
    Read<double>::Read((Read<signed_char> *)this,(Write<double> *)&local_68);
    Write<double>::~Write((Write<double> *)&local_68);
    matrices_times_vectors_dim<3>(Omega_h::Read<double>,Omega_h::Read<double>)::{lambda(int)#1}::
    ~Read((_lambda_int__1_ *)&f);
    Write<double>::~Write(&out);
    RVar4.write_.shared_alloc_.direct_ptr = extraout_RDX;
    RVar4.write_.shared_alloc_.alloc = (Alloc *)this;
    return (Reals)RVar4.write_.shared_alloc_;
  }
  fail("assertion %s failed at %s +%d\n","ms.size() == n * matrix_ncomps(dim, dim)",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_matrix.cpp"
       ,0x35);
}

Assistant:

Reals matrices_times_vectors_dim(Reals ms, Reals vs) {
  auto n = divide_no_remainder(vs.size(), dim);
  OMEGA_H_CHECK(ms.size() == n * matrix_ncomps(dim, dim));
  auto out = Write<Real>(n * dim);
  auto f = OMEGA_H_LAMBDA(LO i) {
    set_vector(out, i, get_matrix<dim, dim>(ms, i) * get_vector<dim>(vs, i));
  };
  parallel_for(n, f, "matrices_times_vectors");
  return out;
}